

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

void set_date_time(uchar *p,time_t t)

{
  int iVar1;
  long lVar2;
  tm tm;
  tm local_58;
  time_t local_20;
  
  local_20 = t;
  tzset();
  localtime_r(&local_20,&local_58);
  lVar2 = 4;
  iVar1 = local_58.tm_year + 0x76c;
  do {
    p[lVar2 + -1] = (char)iVar1 + (char)(iVar1 / 10) * -10 + '0';
    lVar2 = lVar2 + -1;
    iVar1 = iVar1 / 10;
  } while (lVar2 != 0);
  lVar2 = 2;
  iVar1 = local_58.tm_mon + 1;
  do {
    p[lVar2 + 3] = (char)iVar1 + (char)(iVar1 / 10) * -10 + '0';
    lVar2 = lVar2 + -1;
    iVar1 = iVar1 / 10;
  } while (lVar2 != 0);
  lVar2 = 0;
  do {
    p[lVar2 + 7] = (char)local_58.tm_mday + (char)(local_58.tm_mday / 10) * -10 + '0';
    lVar2 = lVar2 + -1;
    local_58.tm_mday = local_58.tm_mday / 10;
  } while (lVar2 != -2);
  lVar2 = 0;
  do {
    p[lVar2 + 9] = (char)local_58.tm_hour + (char)(local_58.tm_hour / 10) * -10 + '0';
    lVar2 = lVar2 + -1;
    local_58.tm_hour = local_58.tm_hour / 10;
  } while (lVar2 != -2);
  lVar2 = 0;
  do {
    p[lVar2 + 0xb] = (char)local_58.tm_min + (char)(local_58.tm_min / 10) * -10 + '0';
    lVar2 = lVar2 + -1;
    local_58.tm_min = local_58.tm_min / 10;
  } while (lVar2 != -2);
  lVar2 = 0;
  do {
    p[lVar2 + 0xd] = (char)local_58.tm_sec + (char)(local_58.tm_sec / 10) * -10 + '0';
    lVar2 = lVar2 + -1;
    local_58.tm_sec = local_58.tm_sec / 10;
  } while (lVar2 != -2);
  lVar2 = 0;
  do {
    p[lVar2 + 0xf] = '0';
    lVar2 = lVar2 + -1;
  } while (lVar2 != -2);
  p[0x10] = SUB161(SEXT816(0x48d159e26af37c05) * SEXT816(local_58.tm_gmtoff),9) -
            (SUB161(SEXT816(0x48d159e26af37c05) * SEXT816(local_58.tm_gmtoff),0xf) >> 7);
  return;
}

Assistant:

static void
set_date_time(unsigned char *p, time_t t)
{
	struct tm tm;

	get_tmfromtime(&tm, &t);
	set_digit(p, 4, tm.tm_year + 1900);
	set_digit(p+4, 2, tm.tm_mon + 1);
	set_digit(p+6, 2, tm.tm_mday);
	set_digit(p+8, 2, tm.tm_hour);
	set_digit(p+10, 2, tm.tm_min);
	set_digit(p+12, 2, tm.tm_sec);
	set_digit(p+14, 2, 0);
	set_num_712(p+16, (char)(get_gmoffset(&tm)/(60*15)));
}